

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_channel_check_throttle(ssh2_channel *c)

{
  byte local_11;
  ssh2_channel *c_local;
  
  local_11 = 0;
  if ((((c->throttled_by_backlog & 1U) == 0) &&
      (local_11 = 0, (c->connlayer->all_channels_throttled & 1U) == 0)) &&
     (local_11 = 0, (c->pending_eof & 1U) == 0)) {
    local_11 = (c->closes & 1U) != 0 ^ 0xff;
  }
  chan_set_input_wanted(c->chan,(_Bool)(local_11 & 1));
  return;
}

Assistant:

static void ssh2_channel_check_throttle(struct ssh2_channel *c)
{
    /*
     * We don't want this channel to read further input if this
     * particular channel has a backed-up SSH window, or if the
     * outgoing side of the whole SSH connection is currently
     * throttled, or if this channel already has an outgoing EOF
     * either sent or pending.
     */
    chan_set_input_wanted(c->chan,
                          !c->throttled_by_backlog &&
                          !c->connlayer->all_channels_throttled &&
                          !c->pending_eof &&
                          !(c->closes & CLOSES_SENT_EOF));
}